

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  char cVar1;
  pointer pbVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  bool bVar6;
  
  if (at == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp"
                  ,0x213b,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  pbVar2 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8);
  if (at <= uVar3) {
    if (uVar3 == at) {
      return true;
    }
    cVar1 = *(char *)(*(long *)&pbVar2[this->m_stringIndex]._M_dataplus + at);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      isBoundary();
    }
    pvVar4 = isWhitespace(char)::chars_abi_cxx11_;
    if ((DAT_0018ad90 != 0) &&
       (pvVar5 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_0018ad90),
       (long)pvVar5 - (long)pvVar4 != -1 && pvVar5 != (void *)0x0)) {
      cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                  _M_dataplus + -1 + at);
      if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
        isBoundary();
      }
      pvVar4 = isWhitespace(char)::chars_abi_cxx11_;
      if (DAT_0018ad90 == 0) {
        return true;
      }
      pvVar5 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_0018ad90);
      if ((long)pvVar5 - (long)pvVar4 == -1 || pvVar5 == (void *)0x0) {
        return true;
      }
    }
    cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                _M_dataplus + at);
    if (isBreakableBefore(char)::chars_abi_cxx11_ == '\0') {
      isBoundary();
    }
    pvVar4 = isBreakableBefore(char)::chars_abi_cxx11_;
    if ((DAT_0018ad40 != 0) &&
       (pvVar5 = memchr(isBreakableBefore(char)::chars_abi_cxx11_,(int)cVar1,DAT_0018ad40),
       pvVar5 != (void *)0x0 && (long)pvVar5 - (long)pvVar4 != -1)) {
      return true;
    }
    cVar1 = *(char *)(*(long *)&(this->m_column->m_strings).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                                _M_dataplus + -1 + at);
    if (isBreakableAfter(char)::chars_abi_cxx11_ == '\0') {
      isBoundary();
    }
    pvVar4 = isBreakableAfter(char)::chars_abi_cxx11_;
    if (DAT_0018ad68 == 0) {
      bVar6 = false;
    }
    else {
      pvVar5 = memchr(isBreakableAfter(char)::chars_abi_cxx11_,(int)cVar1,DAT_0018ad68);
      bVar6 = (long)pvVar5 - (long)pvVar4 != -1 && pvVar5 != (void *)0x0;
    }
    return bVar6;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]magic_enum/test/3rdparty/Catch2/include/catch2/catch.hpp"
                ,0x213c,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}